

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_response.c
# Opt level: O2

void nhr_response_parse_status_code(nhr_response r,char *received)

{
  uint in_EAX;
  int iVar1;
  char *pcVar2;
  ulong uStack_18;
  int code;
  
  uStack_18 = (ulong)in_EAX;
  pcVar2 = strchr(received,0x20);
  if (pcVar2 != (char *)0x0) {
    iVar1 = __isoc99_sscanf(pcVar2," %i",&code);
    if (0 < code && iVar1 == 1) {
      r->status_code = (unsigned_short)(uStack_18 >> 0x20);
    }
  }
  return;
}

Assistant:

void nhr_response_parse_status_code(nhr_response r, char * received) {
	int code = 0;
	char * value = strstr(received, " ");
	if (!value) {
		return;
	}

	if (nhr_sscanf(value, " %i", &code) == 1 && code > 0) {
		r->status_code = code;
	}
}